

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

SSTableDataEntry * __thiscall
SSTable::getEntry(SSTableDataEntry *__return_storage_ptr__,SSTable *this,longlong offset)

{
  fpos<__mbstate_t> local_240;
  undefined1 local_229;
  undefined1 local_228 [8];
  ifstream in;
  longlong offset_local;
  SSTable *this_local;
  SSTableDataEntry *temp;
  
  create_binary_ifstream((path *)local_228);
  local_229 = 0;
  (__return_storage_ptr__->value).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value = 0;
  (__return_storage_ptr__->value)._M_string_length = 0;
  __return_storage_ptr__->key = 0;
  __return_storage_ptr__->value_length = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->timestamp = 0;
  SSTableDataEntry::SSTableDataEntry(__return_storage_ptr__);
  std::fpos<__mbstate_t>::fpos(&local_240,offset);
  std::istream::seekg(local_228,local_240._M_off,local_240._M_state);
  operator>>((istream *)local_228,__return_storage_ptr__);
  local_229 = 1;
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

SSTableDataEntry SSTable::getEntry(long long offset) {
    // Just offer basic reading by offset,
    // search by key in index leave in DiskTable.
    auto in = create_binary_ifstream(file);
    auto temp = SSTableDataEntry{};
    in.seekg(offset);
    in >> temp;
    return temp;
}